

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_test.cpp
# Opt level: O0

void PMPML_64_CPP(void *key,int len,uint32_t seed,void *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  uint64_t *in_RCX;
  uint64_t *puVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  uint in_ESI;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong *in_RDI;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  uint64_t part;
  uint64_t lo;
  uint64_t hi;
  uint64_t rhi_28;
  uint64_t xLast1;
  uint64_t xLast;
  uint64_t rhi_27;
  uint64_t rhi_26;
  uint64_t rhi_25;
  uint64_t rhi_24;
  uint64_t rhi_23;
  uint64_t rhi_22;
  uint64_t rhi_21;
  uint64_t rhi_20;
  uint64_t rhi_19;
  uint64_t rhi_18;
  uint64_t rhi_17;
  uint64_t rhi_16;
  uint64_t rhi_15;
  uint64_t rhi_14;
  uint64_t rhi_13;
  uint64_t rhi_12;
  uint64_t rhi_11;
  uint64_t rhi_10;
  uint64_t rhi_9;
  uint64_t rhi_8;
  uint64_t rhi_7;
  uint64_t rhi_6;
  uint64_t rhi_5;
  uint64_t rhi_4;
  uint64_t rhi_3;
  uint64_t rhi_2;
  uint64_t rhi_1;
  uint64_t rhi;
  uint64_t *x;
  size_t size;
  ULARGE_INTEGER__XX ctr2;
  ULARGE_INTEGER__XX ctr1;
  ULARGE_INTEGER__XX ctr0;
  ULARGE_INTEGER__XX constTerm;
  uint64_t *coeff;
  size_t in_stack_00004f80;
  uchar *in_stack_00004f88;
  PMP_Multilinear_Hasher_64 *in_stack_00004f90;
  ulong local_180;
  long local_178;
  ulong local_160;
  size_t in_stack_fffffffffffffeb0;
  uchar *in_stack_fffffffffffffeb8;
  PMP_Multilinear_Hasher_64 *in_stack_fffffffffffffec0;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  uint64_t local_28;
  
  uVar68 = (ulong)(int)in_ESI;
  if (uVar68 < 0x40) {
    puVar76 = (pmpml_hasher_64.curr_rd)->random_coeff;
    uVar74 = (pmpml_hasher_64.curr_rd)->const_term;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar74;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar74;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar74;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar74;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar74;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar74;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar74;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar74;
    local_68 = 0;
    switch(uVar68 >> 3) {
    case 1:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *in_RDI;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *puVar76;
      auVar1 = auVar1 * auVar31;
      auVar60 = auVar1 + auVar61;
      local_68 = (ulong)CARRY8(auVar1._8_8_,(ulong)CARRY8(uVar74,auVar1._0_8_));
      break;
    case 2:
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *in_RDI;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *puVar76;
      auVar2 = auVar2 * auVar32;
      uVar89 = SUB168(auVar2 + auVar62,0);
      uVar90 = SUB168(auVar2 + auVar62,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RDI[1];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar88 = SUB168(auVar3 * auVar33,8);
      uVar87 = SUB168(auVar3 * auVar33,0);
      uVar73 = (ulong)CARRY8(uVar89,uVar87);
      uVar86 = uVar90 + uVar88;
      auVar60._8_8_ = uVar86 + uVar73;
      auVar60._0_8_ = uVar89 + uVar87;
      local_68 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar74,auVar2._0_8_)) +
                 (ulong)(CARRY8(uVar90,uVar88) || CARRY8(uVar86,uVar73));
      break;
    case 3:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *in_RDI;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *puVar76;
      auVar4 = auVar4 * auVar34;
      uVar86 = SUB168(auVar4 + auVar63,0);
      uVar70 = SUB168(auVar4 + auVar63,8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_RDI[1];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar90 = SUB168(auVar5 * auVar35,8);
      uVar73 = SUB168(auVar5 * auVar35,0);
      uVar77 = uVar86 + uVar73;
      uVar73 = (ulong)CARRY8(uVar86,uVar73);
      uVar87 = uVar70 + uVar90;
      uVar78 = uVar87 + uVar73;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = in_RDI[2];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
      uVar69 = SUB168(auVar6 * auVar36,8);
      uVar89 = SUB168(auVar6 * auVar36,0);
      uVar86 = (ulong)CARRY8(uVar77,uVar89);
      uVar88 = uVar78 + uVar69;
      auVar60._8_8_ = uVar88 + uVar86;
      auVar60._0_8_ = uVar77 + uVar89;
      local_68 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar74,auVar4._0_8_)) +
                 (ulong)(CARRY8(uVar70,uVar90) || CARRY8(uVar87,uVar73)) +
                 (ulong)(CARRY8(uVar78,uVar69) || CARRY8(uVar88,uVar86));
      break;
    case 4:
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *in_RDI;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *puVar76;
      auVar7 = auVar7 * auVar37;
      uVar86 = SUB168(auVar7 + auVar64,0);
      uVar79 = SUB168(auVar7 + auVar64,8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = in_RDI[1];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar77 = SUB168(auVar8 * auVar38,8);
      uVar73 = SUB168(auVar8 * auVar38,0);
      uVar87 = uVar86 + uVar73;
      uVar73 = (ulong)CARRY8(uVar86,uVar73);
      uVar88 = uVar79 + uVar77;
      uVar72 = uVar88 + uVar73;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = in_RDI[2];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
      uVar70 = SUB168(auVar9 * auVar39,8);
      uVar86 = SUB168(auVar9 * auVar39,0);
      uVar71 = uVar87 + uVar86;
      uVar86 = (ulong)CARRY8(uVar87,uVar86);
      uVar89 = uVar72 + uVar70;
      uVar80 = uVar89 + uVar86;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = in_RDI[3];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
      uVar78 = SUB168(auVar10 * auVar40,8);
      uVar69 = SUB168(auVar10 * auVar40,0);
      uVar87 = (ulong)CARRY8(uVar71,uVar69);
      uVar90 = uVar80 + uVar78;
      auVar60._8_8_ = uVar90 + uVar87;
      auVar60._0_8_ = uVar71 + uVar69;
      local_68 = (ulong)CARRY8(auVar7._8_8_,(ulong)CARRY8(uVar74,auVar7._0_8_)) +
                 (ulong)(CARRY8(uVar79,uVar77) || CARRY8(uVar88,uVar73)) +
                 (ulong)(CARRY8(uVar72,uVar70) || CARRY8(uVar89,uVar86)) +
                 (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar90,uVar87));
      break;
    case 5:
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *in_RDI;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *puVar76;
      auVar11 = auVar11 * auVar41;
      uVar86 = SUB168(auVar11 + auVar65,0);
      uVar81 = SUB168(auVar11 + auVar65,8);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = in_RDI[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar78 = SUB168(auVar12 * auVar42,8);
      uVar73 = SUB168(auVar12 * auVar42,0);
      uVar87 = uVar86 + uVar73;
      uVar73 = (ulong)CARRY8(uVar86,uVar73);
      uVar89 = uVar81 + uVar78;
      uVar82 = uVar89 + uVar73;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = in_RDI[2];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
      uVar71 = SUB168(auVar13 * auVar43,8);
      uVar86 = SUB168(auVar13 * auVar43,0);
      uVar88 = uVar87 + uVar86;
      uVar86 = (ulong)CARRY8(uVar87,uVar86);
      uVar90 = uVar82 + uVar71;
      uVar83 = uVar90 + uVar86;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = in_RDI[3];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
      uVar79 = SUB168(auVar14 * auVar44,8);
      uVar87 = SUB168(auVar14 * auVar44,0);
      uVar80 = uVar88 + uVar87;
      uVar87 = (ulong)CARRY8(uVar88,uVar87);
      uVar69 = uVar83 + uVar79;
      uVar84 = uVar69 + uVar87;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = in_RDI[4];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
      uVar72 = SUB168(auVar15 * auVar45,8);
      uVar70 = SUB168(auVar15 * auVar45,0);
      uVar88 = (ulong)CARRY8(uVar80,uVar70);
      uVar77 = uVar84 + uVar72;
      auVar60._8_8_ = uVar77 + uVar88;
      auVar60._0_8_ = uVar80 + uVar70;
      local_68 = (ulong)CARRY8(auVar11._8_8_,(ulong)CARRY8(uVar74,auVar11._0_8_)) +
                 (ulong)(CARRY8(uVar81,uVar78) || CARRY8(uVar89,uVar73)) +
                 (ulong)(CARRY8(uVar82,uVar71) || CARRY8(uVar90,uVar86)) +
                 (ulong)(CARRY8(uVar83,uVar79) || CARRY8(uVar69,uVar87)) +
                 (ulong)(CARRY8(uVar84,uVar72) || CARRY8(uVar77,uVar88));
      break;
    case 6:
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *in_RDI;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *puVar76;
      auVar16 = auVar16 * auVar46;
      uVar86 = SUB168(auVar16 + auVar66,0);
      uVar84 = SUB168(auVar16 + auVar66,8);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = in_RDI[1];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar79 = SUB168(auVar17 * auVar47,8);
      uVar73 = SUB168(auVar17 * auVar47,0);
      uVar87 = uVar86 + uVar73;
      uVar73 = (ulong)CARRY8(uVar86,uVar73);
      uVar90 = uVar84 + uVar79;
      uVar85 = uVar90 + uVar73;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = in_RDI[2];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
      uVar72 = SUB168(auVar18 * auVar48,8);
      uVar86 = SUB168(auVar18 * auVar48,0);
      uVar88 = uVar87 + uVar86;
      uVar86 = (ulong)CARRY8(uVar87,uVar86);
      uVar69 = uVar85 + uVar72;
      uVar91 = uVar69 + uVar86;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = in_RDI[3];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
      uVar80 = SUB168(auVar19 * auVar49,8);
      uVar87 = SUB168(auVar19 * auVar49,0);
      uVar89 = uVar88 + uVar87;
      uVar87 = (ulong)CARRY8(uVar88,uVar87);
      uVar77 = uVar91 + uVar80;
      uVar92 = uVar77 + uVar87;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = in_RDI[4];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
      uVar81 = SUB168(auVar20 * auVar50,8);
      uVar88 = SUB168(auVar20 * auVar50,0);
      uVar83 = uVar89 + uVar88;
      uVar88 = (ulong)CARRY8(uVar89,uVar88);
      uVar70 = uVar92 + uVar81;
      uVar93 = uVar70 + uVar88;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = in_RDI[5];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[5];
      uVar82 = SUB168(auVar21 * auVar51,8);
      uVar71 = SUB168(auVar21 * auVar51,0);
      uVar89 = (ulong)CARRY8(uVar83,uVar71);
      uVar78 = uVar93 + uVar82;
      auVar60._8_8_ = uVar78 + uVar89;
      auVar60._0_8_ = uVar83 + uVar71;
      local_68 = (ulong)CARRY8(auVar16._8_8_,(ulong)CARRY8(uVar74,auVar16._0_8_)) +
                 (ulong)(CARRY8(uVar84,uVar79) || CARRY8(uVar90,uVar73)) +
                 (ulong)(CARRY8(uVar85,uVar72) || CARRY8(uVar69,uVar86)) +
                 (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar77,uVar87)) +
                 (ulong)(CARRY8(uVar92,uVar81) || CARRY8(uVar70,uVar88)) +
                 (ulong)(CARRY8(uVar93,uVar82) || CARRY8(uVar78,uVar89));
      break;
    case 7:
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *in_RDI;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *puVar76;
      auVar22 = auVar22 * auVar52;
      uVar86 = SUB168(auVar22 + auVar67,0);
      uVar92 = SUB168(auVar22 + auVar67,8);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = in_RDI[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[1];
      uVar80 = SUB168(auVar23 * auVar53,8);
      uVar73 = SUB168(auVar23 * auVar53,0);
      uVar87 = uVar86 + uVar73;
      uVar73 = (ulong)CARRY8(uVar86,uVar73);
      uVar69 = uVar92 + uVar80;
      uVar93 = uVar69 + uVar73;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = in_RDI[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[2];
      uVar81 = SUB168(auVar24 * auVar54,8);
      uVar86 = SUB168(auVar24 * auVar54,0);
      uVar88 = uVar87 + uVar86;
      uVar86 = (ulong)CARRY8(uVar87,uVar86);
      uVar77 = uVar93 + uVar81;
      uVar94 = uVar77 + uVar86;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = in_RDI[3];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[3];
      uVar82 = SUB168(auVar25 * auVar55,8);
      uVar87 = SUB168(auVar25 * auVar55,0);
      uVar89 = uVar88 + uVar87;
      uVar87 = (ulong)CARRY8(uVar88,uVar87);
      uVar70 = uVar94 + uVar82;
      uVar95 = uVar70 + uVar87;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = in_RDI[4];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[4];
      uVar83 = SUB168(auVar26 * auVar56,8);
      uVar88 = SUB168(auVar26 * auVar56,0);
      uVar90 = uVar89 + uVar88;
      uVar88 = (ulong)CARRY8(uVar89,uVar88);
      uVar78 = uVar95 + uVar83;
      uVar96 = uVar78 + uVar88;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = in_RDI[5];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[5];
      uVar84 = SUB168(auVar27 * auVar57,8);
      uVar89 = SUB168(auVar27 * auVar57,0);
      uVar91 = uVar90 + uVar89;
      uVar89 = (ulong)CARRY8(uVar90,uVar89);
      uVar71 = uVar96 + uVar84;
      uVar97 = uVar71 + uVar89;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = in_RDI[6];
      auVar58._8_8_ = 0;
      auVar58._0_8_ = (pmpml_hasher_64.curr_rd)->random_coeff[6];
      uVar85 = SUB168(auVar28 * auVar58,8);
      uVar72 = SUB168(auVar28 * auVar58,0);
      uVar90 = (ulong)CARRY8(uVar91,uVar72);
      uVar79 = uVar97 + uVar85;
      auVar60._8_8_ = uVar79 + uVar90;
      auVar60._0_8_ = uVar91 + uVar72;
      local_68 = (ulong)CARRY8(auVar22._8_8_,(ulong)CARRY8(uVar74,auVar22._0_8_)) +
                 (ulong)(CARRY8(uVar92,uVar80) || CARRY8(uVar69,uVar73)) +
                 (ulong)(CARRY8(uVar93,uVar81) || CARRY8(uVar77,uVar86)) +
                 (ulong)(CARRY8(uVar94,uVar82) || CARRY8(uVar70,uVar87)) +
                 (ulong)(CARRY8(uVar95,uVar83) || CARRY8(uVar78,uVar88)) +
                 (ulong)(CARRY8(uVar96,uVar84) || CARRY8(uVar71,uVar89)) +
                 (ulong)(CARRY8(uVar97,uVar85) || CARRY8(uVar79,uVar90));
    }
    local_60 = auVar60._8_8_;
    local_58 = auVar60._0_8_;
    switch(in_ESI & 7) {
    case 0:
      local_160 = 1;
      break;
    case 1:
      local_160 = (ulong)(int)(*(byte *)((long)in_RDI + (uVar68 - 1)) + 0x100);
      break;
    case 2:
      local_160 = (ulong)(int)(*(ushort *)((long)in_RDI + (uVar68 - 2)) + 0x10000);
      break;
    case 3:
      local_160 = (ulong)*(byte *)((long)in_RDI + (uVar68 - 1)) * 0x10000 +
                  (ulong)*(ushort *)((long)in_RDI + (uVar68 - 3)) + 0x1000000;
      break;
    case 4:
      local_160 = (ulong)*(uint *)((long)in_RDI + (uVar68 - 4)) + 0x100000000;
      break;
    case 5:
      local_160 = ((ulong)*(byte *)((long)in_RDI + (uVar68 - 1)) << 0x20) + 0x10000000000 +
                  (ulong)*(uint *)((long)in_RDI + (uVar68 - 5));
      break;
    case 6:
      local_160 = ((ulong)*(ushort *)((long)in_RDI + (uVar68 - 2)) << 0x20) + 0x1000000000000 +
                  (ulong)*(uint *)((long)in_RDI + (uVar68 - 6));
      break;
    default:
      local_160 = ((ulong)*(ushort *)((long)in_RDI + (uVar68 - 3)) << 0x20) + 0x100000000000000 +
                  (ulong)*(uint *)((long)in_RDI + (uVar68 - 7)) +
                  ((ulong)*(byte *)((long)in_RDI + (uVar68 - 1)) << 0x30);
    }
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_160;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = puVar76[uVar68 >> 3];
    uVar86 = SUB168(auVar29 * auVar59,8);
    uVar73 = SUB168(auVar29 * auVar59,0);
    uVar68 = (ulong)CARRY8(local_58,uVar73);
    uVar74 = local_60 + uVar86;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar74 + uVar68;
    local_178 = SUB168(auVar30 * ZEXT816(0xd),8);
    local_180 = SUB168(auVar30 * ZEXT816(0xd),0);
    uVar68 = (local_68 + (CARRY8(local_60,uVar86) || CARRY8(uVar74,uVar68))) * 0xa9 +
             local_178 * 0xd + 0xd;
    uVar74 = uVar68 + local_58 + uVar73;
    lVar75 = (long)(int)((uVar74 < uVar68) + 1) - (ulong)(uVar74 < local_180);
    uVar74 = uVar74 - local_180;
    if (uVar74 < 0x1a) {
      uVar74 = uVar74 + lVar75 * -0xd;
      if (uVar74 < 0x1a) {
        local_28 = fmix64_short(uVar74);
      }
      else {
        local_28 = fmix64_short(uVar74 + 0xd);
      }
    }
    else {
      local_28 = fmix64_short(uVar74 + lVar75 * -0xd);
    }
  }
  else if (uVar68 < 0x80) {
    local_28 = PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_SingleChunk
                         (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0);
  }
  else {
    local_28 = PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_type2
                         (in_stack_00004f90,in_stack_00004f88,in_stack_00004f80);
  }
  *in_RCX = local_28;
  return;
}

Assistant:

void PMPML_64_CPP( const void * key, int len, uint32_t seed, void * res )
{
  //pmpml_hasher_64.seed (seed);
	*(uint64_t*)res = pmpml_hasher_64.hash( (const unsigned char*)key, len );
}